

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::setIntegrator
          (MultipleShootingTranscription *this,
          shared_ptr<iDynTree::optimalcontrol::integrators::Integrator> *integrationMethod)

{
  bool bVar1;
  __shared_ptr *in_RSI;
  long in_RDI;
  shared_ptr<iDynTree::optimalcontrol::integrators::Integrator> *in_stack_ffffffffffffffc8;
  bool local_1;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x38));
    if (bVar1) {
      iDynTree::reportError
                ("MultipleShootingSolver","setIntegrator",
                 "The integration method for this instance has already been set.");
      local_1 = false;
    }
    else {
      std::shared_ptr<iDynTree::optimalcontrol::integrators::Integrator>::operator=
                ((shared_ptr<iDynTree::optimalcontrol::integrators::Integrator> *)in_RSI,
                 in_stack_ffffffffffffffc8);
      local_1 = true;
    }
  }
  else {
    iDynTree::reportError("MultipleShootingSolver","setIntegrator","Empty pointer.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool setIntegrator(const std::shared_ptr<Integrator> integrationMethod) {
                if (!(integrationMethod)) {
                    reportError("MultipleShootingSolver", "setIntegrator", "Empty pointer.");
                    return false;
                }

                if (m_integrator){
                    reportError("MultipleShootingSolver", "setIntegrator", "The integration method for this instance has already been set.");
                    return false;
                }

                m_integrator = integrationMethod;
                return true;
            }